

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void forbody(LexState *ls,int base,int line,int nvars,int isnum)

{
  FuncState *fs_00;
  int iVar1;
  int in_ECX;
  int in_EDX;
  LexState *in_RDI;
  int in_R8D;
  int endfor;
  int prep;
  FuncState *fs;
  BlockCnt bl;
  int in_stack_ffffffffffffffa8;
  OpCode in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc0;
  BlockCnt local_28;
  int local_18;
  int local_14;
  int local_10;
  LexState *local_8;
  
  fs_00 = in_RDI->fs;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_8 = in_RDI;
  adjustlocalvars(in_RDI,3);
  checknext((LexState *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
            in_stack_ffffffffffffffac);
  if (local_18 == 0) {
    iVar1 = luaK_jump((FuncState *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  else {
    iVar1 = luaK_codeABx((FuncState *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,0);
  }
  enterblock(fs_00,&local_28,'\0');
  adjustlocalvars(local_8,local_14);
  luaK_reserveregs((FuncState *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac);
  block((LexState *)CONCAT44(iVar1,in_stack_ffffffffffffffc0));
  leaveblock((FuncState *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  luaK_patchtohere((FuncState *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac);
  if (local_18 == 0) {
    iVar1 = luaK_codeABC((FuncState *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,0,0x119b5f);
  }
  else {
    iVar1 = luaK_codeABx((FuncState *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,0);
  }
  luaK_fixline(fs_00,local_10);
  if (local_18 == 0) {
    iVar1 = luaK_jump((FuncState *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  luaK_patchlist((FuncState *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac,
                 in_stack_ffffffffffffffa8);
  return;
}

Assistant:

static void forbody(LexState*ls,int base,int line,int nvars,int isnum){
BlockCnt bl;
FuncState*fs=ls->fs;
int prep,endfor;
adjustlocalvars(ls,3);
checknext(ls,TK_DO);
prep=isnum?luaK_codeAsBx(fs,OP_FORPREP,base,(-1)):luaK_jump(fs);
enterblock(fs,&bl,0);
adjustlocalvars(ls,nvars);
luaK_reserveregs(fs,nvars);
block(ls);
leaveblock(fs);
luaK_patchtohere(fs,prep);
endfor=(isnum)?luaK_codeAsBx(fs,OP_FORLOOP,base,(-1)):
luaK_codeABC(fs,OP_TFORLOOP,base,0,nvars);
luaK_fixline(fs,line);
luaK_patchlist(fs,(isnum?endfor:luaK_jump(fs)),prep+1);
}